

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::blitFramebuffer
          (ReferenceContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,
          int dstX1,int dstY1,deUint32 mask,deUint32 filter)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deBool dVar9;
  int iVar10;
  uint uVar11;
  TextureChannelClass TVar12;
  FilterMode minFilter_;
  deInt32 dVar13;
  deInt32 dVar14;
  ConstPixelBufferAccess *pCVar15;
  TextureFormat *pTVar16;
  TextureFormat *pTVar17;
  int *piVar18;
  void *pvVar19;
  float *pfVar20;
  uint *puVar21;
  float fVar22;
  float fVar23;
  bool local_b42;
  bool local_b1e;
  bool local_b1d;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  bool local_a31;
  undefined1 local_a30 [24];
  deUint32 srcStencil;
  float sY_2;
  float sX_2;
  float dY_2;
  float dX_2;
  int sampleNdx_1;
  int xo_2;
  int yo_2;
  MultisamplePixelBufferAccess local_9d8;
  undefined1 local_9b0 [8];
  MultisamplePixelBufferAccess dst_2;
  MultisamplePixelBufferAccess local_960;
  MultisamplePixelBufferAccess local_938;
  undefined1 local_910 [8];
  MultisampleConstPixelBufferAccess src_2;
  float sY_1;
  float sX_1;
  float dY_1;
  float dX_1;
  int sampleNdx;
  int xo_1;
  int yo_1;
  MultisamplePixelBufferAccess local_8a0;
  undefined1 local_878 [8];
  MultisamplePixelBufferAccess dst_1;
  MultisamplePixelBufferAccess local_828;
  MultisamplePixelBufferAccess local_800;
  undefined1 local_7d8 [8];
  MultisampleConstPixelBufferAccess src_1;
  Vector<float,_4> local_7a0;
  undefined1 local_790 [8];
  Vec4 p;
  float sY;
  float sX;
  float dY;
  float dX;
  int xo;
  int yo;
  PixelBufferAccess local_760;
  TextureFormat local_738;
  undefined1 local_730 [16];
  int local_720 [2];
  int aiStack_718 [2];
  void *local_710;
  ApiType local_708;
  bool local_701;
  TextureFormat TStack_700;
  bool convertSRGB;
  byte local_6f1;
  TextureFormat TStack_6f0;
  bool dstIsSRGB;
  byte local_6e1;
  undefined1 local_6e0 [7];
  bool srcIsSRGB;
  undefined1 local_6d0 [8];
  Sampler sampler;
  FilterMode sFilter;
  undefined1 local_688 [3];
  bool dstIsFloat;
  TextureChannelClass dstClass;
  PixelBufferAccess local_660;
  undefined1 local_638 [8];
  PixelBufferAccess dst;
  PixelBufferAccess local_5e8;
  ConstPixelBufferAccess local_5c0;
  undefined1 auStack_598 [8];
  ConstPixelBufferAccess src;
  Vector<float,_2> local_568;
  Matrix<float,_3,_3> local_560;
  Vector<float,_3> local_530;
  Matrix<float,_3,_3> local_524;
  Vector<float,_2> local_500;
  Matrix<float,_3,_3> local_4f8;
  Matrix<float,_3,_3> local_4d4;
  undefined1 local_4b0 [8];
  Mat3 transform;
  deUint32 error;
  Vector<int,_4> local_460;
  MultisamplePixelBufferAccess local_450;
  MultisampleConstPixelBufferAccess local_428;
  IVec4 local_400;
  Vector<int,_4> local_3f0;
  MultisamplePixelBufferAccess local_3e0;
  MultisampleConstPixelBufferAccess local_3b8;
  IVec4 local_390;
  Vector<int,_4> local_380;
  MultisamplePixelBufferAccess local_370;
  MultisampleConstPixelBufferAccess local_348;
  IVec4 local_320;
  Vector<int,_4> local_310;
  MultisamplePixelBufferAccess local_300;
  MultisampleConstPixelBufferAccess local_2d8;
  IVec4 local_2b0;
  Vector<int,_4> local_2a0;
  MultisamplePixelBufferAccess local_290;
  MultisampleConstPixelBufferAccess local_268;
  IVec4 local_240;
  Vector<int,_4> local_230;
  MultisamplePixelBufferAccess local_220;
  MultisampleConstPixelBufferAccess local_1f8;
  IVec4 local_1d0;
  Vector<int,_4> local_1c0;
  MultisamplePixelBufferAccess local_1b0;
  MultisamplePixelBufferAccess local_188;
  MultisamplePixelBufferAccess local_160;
  MultisamplePixelBufferAccess local_138;
  MultisamplePixelBufferAccess local_110;
  MultisamplePixelBufferAccess local_e8;
  MultisamplePixelBufferAccess local_c0;
  MultisamplePixelBufferAccess local_98;
  undefined1 local_6c [8];
  IVec4 dstRect;
  IVec4 srcRect;
  int dstOriginY;
  int dstOriginX;
  int srcOriginY;
  int srcOriginX;
  bool scale;
  int dstH;
  int dstW;
  int srcH;
  int srcW;
  bool swapDstY;
  bool swapDstX;
  bool swapSrcY;
  bool swapSrcX;
  int dstX0_local;
  int srcY1_local;
  int srcX1_local;
  int srcY0_local;
  int srcX0_local;
  ReferenceContext *this_local;
  
  iVar5 = de::abs<int>(srcX1 - srcX0);
  iVar6 = de::abs<int>(srcY1 - srcY0);
  iVar7 = de::abs<int>(dstX1 - dstX0);
  iVar8 = de::abs<int>(dstY1 - dstY0);
  local_a31 = iVar5 != iVar7 || iVar6 != iVar8;
  local_a44 = srcX0;
  if (srcX1 < srcX0) {
    local_a44 = srcX1;
  }
  local_a48 = srcY0;
  if (srcY1 < srcY0) {
    local_a48 = srcY1;
  }
  local_a4c = dstX0;
  if (dstX1 < dstX0) {
    local_a4c = dstX1;
  }
  if (dstY1 < dstY0) {
    local_a50 = dstY1;
  }
  else {
    local_a50 = dstY0;
  }
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)(dstRect.m_data + 2),local_a44,local_a48,iVar5,iVar6);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_6c,local_a4c,local_a50,iVar7,iVar8);
  do {
    if ((filter != 0x2600) && (filter != 0x2601)) {
      setError(this,0x500);
      return;
    }
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    if (((mask & 0x500) != 0) && (filter != 0x2600)) {
      setError(this,0x502);
      return;
    }
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    iVar10 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
    if ((iVar10 != 0x8cd5) ||
       (iVar10 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca8), iVar10 != 0x8cd5)) {
      setError(this,0x502);
      return;
    }
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    getDrawColorbuffer(&local_98,this);
    iVar10 = rr::MultisamplePixelBufferAccess::getNumSamples(&local_98);
    if (iVar10 != 1) {
      setError(this,0x502);
      return;
    }
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  getReadColorbuffer(&local_c0,this);
  iVar10 = rr::MultisamplePixelBufferAccess::getNumSamples(&local_c0);
  if (iVar10 != 1) {
    do {
      if ((iVar5 != iVar7) || (iVar6 != iVar8)) {
        setError(this,0x502);
        return;
      }
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
    uVar11 = mask & 0x4000;
    while (uVar11 != 0) {
      getReadColorbuffer(&local_e8,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_e8)->super_ConstPixelBufferAccess;
      pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      getDrawColorbuffer(&local_110,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_110)->super_ConstPixelBufferAccess;
      pTVar17 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      bVar4 = tcu::TextureFormat::operator!=(pTVar16,pTVar17);
      if (bVar4) {
        setError(this,0x502);
        return;
      }
      uVar11 = ::deGetFalse();
    }
    uVar11 = mask & 0x100;
    while (uVar11 != 0) {
      getReadDepthbuffer(&local_138,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_138)->super_ConstPixelBufferAccess;
      pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      getDrawDepthbuffer(&local_160,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_160)->super_ConstPixelBufferAccess;
      pTVar17 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      bVar4 = tcu::TextureFormat::operator!=(pTVar16,pTVar17);
      if (bVar4) {
        setError(this,0x502);
        return;
      }
      uVar11 = ::deGetFalse();
    }
    uVar11 = mask & 0x400;
    while (uVar11 != 0) {
      getReadStencilbuffer(&local_188,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_188)->super_ConstPixelBufferAccess;
      pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      getDrawStencilbuffer(&local_1b0,this);
      pCVar15 = &rr::MultisamplePixelBufferAccess::raw(&local_1b0)->super_ConstPixelBufferAccess;
      pTVar17 = tcu::ConstPixelBufferAccess::getFormat(pCVar15);
      bVar4 = tcu::TextureFormat::operator!=(pTVar16,pTVar17);
      if (bVar4) {
        setError(this,0x502);
        return;
      }
      uVar11 = ::deGetFalse();
    }
  }
  if ((mask & 0x4000) == 0) {
    tcu::Vector<int,_4>::Vector(&local_1c0,(Vector<int,_4> *)(dstRect.m_data + 2));
  }
  else {
    getReadColorbuffer(&local_220,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_1f8,&local_220);
    getBufferRect((sglr *)&local_1d0,&local_1f8);
    intersect((sglr *)&local_1c0,(IVec4 *)(dstRect.m_data + 2),&local_1d0);
  }
  dstRect.m_data[2] = local_1c0.m_data[0];
  dstRect.m_data[3] = local_1c0.m_data[1];
  if ((mask & 0x100) == 0) {
    tcu::Vector<int,_4>::Vector(&local_230,(Vector<int,_4> *)(dstRect.m_data + 2));
  }
  else {
    getReadDepthbuffer(&local_290,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_268,&local_290);
    getBufferRect((sglr *)&local_240,&local_268);
    intersect((sglr *)&local_230,(IVec4 *)(dstRect.m_data + 2),&local_240);
  }
  dstRect.m_data[2] = local_230.m_data[0];
  dstRect.m_data[3] = local_230.m_data[1];
  if ((mask & 0x400) == 0) {
    tcu::Vector<int,_4>::Vector(&local_2a0,(Vector<int,_4> *)(dstRect.m_data + 2));
  }
  else {
    getReadStencilbuffer(&local_300,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_2d8,&local_300);
    getBufferRect((sglr *)&local_2b0,&local_2d8);
    intersect((sglr *)&local_2a0,(IVec4 *)(dstRect.m_data + 2),&local_2b0);
  }
  dstRect.m_data[2] = local_2a0.m_data[0];
  dstRect.m_data[3] = local_2a0.m_data[1];
  if ((mask & 0x4000) == 0) {
    tcu::Vector<int,_4>::Vector(&local_310,(Vector<int,_4> *)local_6c);
  }
  else {
    getDrawColorbuffer(&local_370,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_348,&local_370);
    getBufferRect((sglr *)&local_320,&local_348);
    intersect((sglr *)&local_310,(IVec4 *)local_6c,&local_320);
  }
  local_6c._0_4_ = local_310.m_data[0];
  local_6c._4_4_ = local_310.m_data[1];
  dstRect.m_data[0] = local_310.m_data[2];
  dstRect.m_data[1] = local_310.m_data[3];
  if ((mask & 0x100) == 0) {
    tcu::Vector<int,_4>::Vector(&local_380,(Vector<int,_4> *)local_6c);
  }
  else {
    getDrawDepthbuffer(&local_3e0,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_3b8,&local_3e0);
    getBufferRect((sglr *)&local_390,&local_3b8);
    intersect((sglr *)&local_380,(IVec4 *)local_6c,&local_390);
  }
  local_6c._0_4_ = local_380.m_data[0];
  local_6c._4_4_ = local_380.m_data[1];
  dstRect.m_data[0] = local_380.m_data[2];
  dstRect.m_data[1] = local_380.m_data[3];
  if ((mask & 0x400) == 0) {
    tcu::Vector<int,_4>::Vector(&local_3f0,(Vector<int,_4> *)local_6c);
  }
  else {
    getDrawStencilbuffer(&local_450,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_428,&local_450);
    getBufferRect((sglr *)&local_400,&local_428);
    intersect((sglr *)&local_3f0,(IVec4 *)local_6c,&local_400);
  }
  local_6c._0_4_ = local_3f0.m_data[0];
  local_6c._4_4_ = local_3f0.m_data[1];
  dstRect.m_data[0] = local_3f0.m_data[2];
  dstRect.m_data[1] = local_3f0.m_data[3];
  if ((this->m_scissorEnabled & 1U) == 0) {
    tcu::Vector<int,_4>::Vector(&local_460,(Vector<int,_4> *)local_6c);
  }
  else {
    intersect((sglr *)&local_460,(IVec4 *)local_6c,&this->m_scissorBox);
  }
  local_6c._0_4_ = local_460.m_data[0];
  local_6c._4_4_ = local_460.m_data[1];
  dstRect.m_data[0] = local_460.m_data[2];
  dstRect.m_data[1] = local_460.m_data[3];
  bVar4 = isEmpty((IVec4 *)(dstRect.m_data + 2));
  if ((!bVar4) && (bVar4 = isEmpty((IVec4 *)local_6c), !bVar4)) {
    getReadColorbuffer((MultisamplePixelBufferAccess *)(transform.m_data.m_data[2].m_data + 2),this)
    ;
    iVar5 = rr::MultisamplePixelBufferAccess::getNumSamples
                      ((MultisamplePixelBufferAccess *)(transform.m_data.m_data[2].m_data + 2));
    if (iVar5 == 1) {
      piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(dstRect.m_data + 2));
      iVar5 = *piVar18;
      piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(dstRect.m_data + 2));
      tcu::Vector<float,_2>::Vector(&local_500,(float)(srcX0 - iVar5),(float)(srcY0 - *piVar18));
      tcu::translationMatrix<float,_2>(&local_4f8,&local_500);
      tcu::Vector<float,_3>::Vector
                (&local_530,(float)(srcX1 - srcX0) / (float)(dstX1 - dstX0),
                 (float)(srcY1 - srcY0) / (float)(dstY1 - dstY0),1.0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_524,&local_530);
      tcu::operator*(&local_4d4,&local_4f8,&local_524);
      piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
      iVar5 = *piVar18;
      piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
      tcu::Vector<float,_2>::Vector(&local_568,(float)(iVar5 - dstX0),(float)(*piVar18 - dstY0));
      tcu::translationMatrix<float,_2>(&local_560,&local_568);
      tcu::operator*((Matrix<float,_3,_3> *)local_4b0,&local_4d4,&local_560);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_560);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_4d4);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_524);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_4f8);
      if ((mask & 0x4000) != 0) {
        getReadColorbuffer((MultisamplePixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data,
                           this);
        rr::MultisamplePixelBufferAccess::toSinglesampleAccess
                  (&local_5e8,
                   (MultisamplePixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(dstRect.m_data + 2));
        tcu::getSubregion((PixelBufferAccess *)&local_5c0,&local_5e8,iVar5,iVar6,iVar7,*piVar18);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)auStack_598,&local_5c0);
        getDrawColorbuffer((MultisamplePixelBufferAccess *)local_688,this);
        rr::MultisamplePixelBufferAccess::toSinglesampleAccess
                  (&local_660,(MultisamplePixelBufferAccess *)local_688);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c);
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c);
        tcu::getSubregion((PixelBufferAccess *)local_638,&local_660,iVar5,iVar6,iVar7,*piVar18);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_638);
        TVar12 = tcu::getTextureChannelClass(pTVar16->type);
        local_b1d = true;
        if ((TVar12 != TEXTURECHANNELCLASS_FLOATING_POINT) &&
           (local_b1d = true, TVar12 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
          local_b1d = TVar12 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
        }
        sampler.depthStencilMode._3_1_ = local_b1d;
        local_b1e = local_a31 && filter == 0x2601;
        minFilter_ = (FilterMode)local_b1e;
        sampler._52_4_ = minFilter_;
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_6e0,0.0,0.0,0.0,0.0);
        tcu::Sampler::Sampler
                  ((Sampler *)local_6d0,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,minFilter_,
                   minFilter_,0.0,false,COMPAREMODE_NONE,0,(Vec4 *)local_6e0,false,MODE_DEPTH);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)auStack_598);
        TStack_6f0 = *pTVar16;
        local_6e1 = tcu::isSRGB(TStack_6f0);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_638);
        TStack_700 = *pTVar16;
        local_6f1 = tcu::isSRGB(TStack_700);
        local_b42 = false;
        if ((this->m_sRGBUpdateEnabled & 1U) != 0) {
          local_708.m_bits = (deUint32)Context::getType(&this->super_Context);
          local_b42 = glu::isContextTypeES((ContextType)local_708.m_bits);
        }
        local_701 = local_b42;
        if (local_b42 == false) {
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)auStack_598);
          local_738 = toNonSRGBFormat(pTVar16);
          iVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)auStack_598);
          iVar6 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)auStack_598);
          iVar7 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)auStack_598);
          iVar8 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)auStack_598);
          iVar10 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)auStack_598)
          ;
          pvVar19 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)auStack_598);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_730,&local_738,iVar5,iVar6,iVar7,iVar8,iVar10,
                     pvVar19);
          src.m_pitch.m_data._4_8_ = local_710;
          src.m_size.m_data[0] = local_720[0];
          src.m_size.m_data[1] = local_720[1];
          src.m_size.m_data[2] = aiStack_718[0];
          src.m_pitch.m_data[0] = aiStack_718[1];
          auStack_598 = (undefined1  [8])local_730._0_8_;
          src.m_format.order = local_730._8_4_;
          src.m_format.type = local_730._12_4_;
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_638);
          _xo = toNonSRGBFormat(pTVar16);
          iVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_638);
          iVar6 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_638);
          iVar7 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_638);
          iVar8 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_638);
          iVar10 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)local_638);
          pvVar19 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_638);
          tcu::PixelBufferAccess::PixelBufferAccess
                    (&local_760,(TextureFormat *)&xo,iVar5,iVar6,iVar7,iVar8,iVar10,pvVar19);
          memcpy(local_638,&local_760,0x28);
        }
        for (dX = 0.0; piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c),
            (int)dX < *piVar18; dX = (float)((int)dX + 1)) {
          for (dY = 0.0; piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c),
              (int)dY < *piVar18; dY = (float)((int)dY + 1)) {
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,0);
            fVar22 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,1);
            fVar1 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,2);
            p.m_data[3] = fVar22 * ((float)(int)dY + 0.5) + fVar1 * ((float)(int)dX + 0.5) +
                          *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,0);
            fVar22 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,1);
            fVar1 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,2);
            fVar23 = p.m_data[3];
            p.m_data[2] = fVar22 * ((float)(int)dY + 0.5) + fVar1 * ((float)(int)dX + 0.5) +
                          *pfVar20;
            if ((((0.0 <= p.m_data[3]) &&
                 (piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(dstRect.m_data + 2)),
                 fVar22 = p.m_data[2], fVar23 < (float)*piVar18)) && (0.0 <= p.m_data[2])) &&
               (piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(dstRect.m_data + 2)),
               fVar22 < (float)*piVar18)) {
              if ((((sampler.depthStencilMode._3_1_ & 1) == MODE_DEPTH >> 0x18) &&
                  ((local_6e1 & 1) == 0)) && (filter != 1)) {
                dVar13 = deFloorFloatToInt32(p.m_data[3]);
                dVar14 = deFloorFloatToInt32(p.m_data[2]);
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&src_1.m_access.m_data,(int)auStack_598,dVar13,
                           dVar14);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_638,(IVec4 *)&src_1.m_access.m_data,(int)dY,
                           (int)dX,0);
              }
              else {
                tcu::ConstPixelBufferAccess::sample2D
                          ((ConstPixelBufferAccess *)local_790,(Sampler *)auStack_598,
                           (FilterMode)local_6d0,p.m_data[3],p.m_data[2],sampler.wrapT);
                if (((local_6f1 & 1) == 0) || ((local_701 & 1U) == 0)) {
                  tcu::Vector<float,_4>::Vector(&local_7a0,(Vector<float,_4> *)local_790);
                }
                else {
                  tcu::linearToSRGB((tcu *)&local_7a0,(Vec4 *)local_790);
                }
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_638,&local_7a0,(int)dY,(int)dX,0);
              }
            }
          }
        }
      }
      if (((mask & 0x100) != 0) && ((this->m_depthMask & 1U) != 0)) {
        getReadDepthbuffer((MultisamplePixelBufferAccess *)
                           &dst_1.m_access.super_ConstPixelBufferAccess.m_data,this);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(dstRect.m_data + 2));
        rr::getSubregion(&local_828,
                         (MultisamplePixelBufferAccess *)
                         &dst_1.m_access.super_ConstPixelBufferAccess.m_data,iVar5,iVar6,iVar7,
                         *piVar18);
        getDepthMultisampleAccess(&local_800,&local_828);
        rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  ((MultisampleConstPixelBufferAccess *)local_7d8,&local_800);
        getDrawDepthbuffer((MultisamplePixelBufferAccess *)&xo_1,this);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c);
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c);
        rr::getSubregion(&local_8a0,(MultisamplePixelBufferAccess *)&xo_1,iVar5,iVar6,iVar7,*piVar18
                        );
        getDepthMultisampleAccess((MultisamplePixelBufferAccess *)local_878,&local_8a0);
        for (sampleNdx = 0; piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c),
            sampleNdx < *piVar18; sampleNdx = sampleNdx + 1) {
          for (dX_1 = 0.0; piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c),
              (int)dX_1 < *piVar18; dX_1 = (float)((int)dX_1 + 1)) {
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,0);
            fVar22 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,1);
            fVar1 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,2);
            fVar23 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,0);
            fVar2 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,1);
            fVar3 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,2);
            src_2.m_access.m_data._4_4_ =
                 fVar2 * ((float)(int)dX_1 + 0.5) + fVar3 * ((float)sampleNdx + 0.5) + *pfVar20;
            pCVar15 = rr::MultisampleConstPixelBufferAccess::raw
                                ((MultisampleConstPixelBufferAccess *)local_7d8);
            dVar13 = deFloorFloatToInt32(fVar22 * ((float)(int)dX_1 + 0.5) +
                                         fVar1 * ((float)sampleNdx + 0.5) + fVar23);
            dVar14 = deFloorFloatToInt32(src_2.m_access.m_data._4_4_);
            fVar22 = tcu::ConstPixelBufferAccess::getPixDepth(pCVar15,0,dVar13,dVar14);
            writeDepthOnly((MultisamplePixelBufferAccess *)local_878,0,(int)dX_1,sampleNdx,fVar22);
          }
        }
      }
      if ((mask & 0x400) != 0) {
        getReadStencilbuffer
                  ((MultisamplePixelBufferAccess *)
                   &dst_2.m_access.super_ConstPixelBufferAccess.m_data,this);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(dstRect.m_data + 2));
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(dstRect.m_data + 2));
        rr::getSubregion(&local_960,
                         (MultisamplePixelBufferAccess *)
                         &dst_2.m_access.super_ConstPixelBufferAccess.m_data,iVar5,iVar6,iVar7,
                         *piVar18);
        getStencilMultisampleAccess(&local_938,&local_960);
        rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  ((MultisampleConstPixelBufferAccess *)local_910,&local_938);
        getDrawStencilbuffer((MultisamplePixelBufferAccess *)&xo_2,this);
        piVar18 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
        iVar5 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
        iVar6 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c);
        iVar7 = *piVar18;
        piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c);
        rr::getSubregion(&local_9d8,(MultisamplePixelBufferAccess *)&xo_2,iVar5,iVar6,iVar7,*piVar18
                        );
        getStencilMultisampleAccess((MultisamplePixelBufferAccess *)local_9b0,&local_9d8);
        for (sampleNdx_1 = 0; iVar5 = sampleNdx_1,
            piVar18 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c), iVar5 < *piVar18;
            sampleNdx_1 = sampleNdx_1 + 1) {
          for (dX_2 = 0.0; fVar22 = dX_2,
              piVar18 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c), (int)fVar22 < *piVar18;
              dX_2 = (float)((int)dX_2 + 1)) {
            dY_2 = 0.0;
            sX_2 = (float)(int)dX_2 + 0.5;
            sY_2 = (float)sampleNdx_1 + 0.5;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,0);
            fVar1 = sX_2;
            fVar22 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,1);
            fVar23 = *pfVar20 * sY_2;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,0,2);
            srcStencil = (deUint32)(fVar22 * fVar1 + fVar23 + *pfVar20);
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,0);
            fVar1 = sX_2;
            fVar22 = *pfVar20;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,1);
            fVar23 = *pfVar20 * sY_2;
            pfVar20 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)local_4b0,1,2);
            local_a30._20_4_ = fVar22 * fVar1 + fVar23 + *pfVar20;
            pCVar15 = rr::MultisampleConstPixelBufferAccess::raw
                                ((MultisampleConstPixelBufferAccess *)local_910);
            dVar13 = deFloorFloatToInt32((float)srcStencil);
            deFloorFloatToInt32((float)local_a30._20_4_);
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)local_a30,(int)pCVar15,0,dVar13);
            puVar21 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_a30);
            local_a30._16_4_ = *puVar21;
            writeMaskedStencil((MultisamplePixelBufferAccess *)local_9b0,0,(int)dX_2,sampleNdx_1,
                               local_a30._16_4_,this->m_stencil[0].writeMask);
          }
        }
      }
      tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_4b0);
    }
    else {
      transform.m_data.m_data[2].m_data[1] =
           (float)blitResolveMultisampleFramebuffer
                            (this,mask,(IVec4 *)(dstRect.m_data + 2),(IVec4 *)local_6c,
                             srcX1 < srcX0 != dstX1 < dstX0,srcY1 < srcY0 != dstY1 < dstY0);
      if (transform.m_data.m_data[2].m_data[1] != 0.0) {
        setError(this,(deUint32)transform.m_data.m_data[2].m_data[1]);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	// p0 in inclusive, p1 exclusive.
	// Negative width/height means swap.
	bool	swapSrcX	= srcX1 < srcX0;
	bool	swapSrcY	= srcY1 < srcY0;
	bool	swapDstX	= dstX1 < dstX0;
	bool	swapDstY	= dstY1 < dstY0;
	int		srcW		= de::abs(srcX1-srcX0);
	int		srcH		= de::abs(srcY1-srcY0);
	int		dstW		= de::abs(dstX1-dstX0);
	int		dstH		= de::abs(dstY1-dstY0);
	bool	scale		= srcW != dstW || srcH != dstH;
	int		srcOriginX	= swapSrcX ? srcX1 : srcX0;
	int		srcOriginY	= swapSrcY ? srcY1 : srcY0;
	int		dstOriginX	= swapDstX ? dstX1 : dstX0;
	int		dstOriginY	= swapDstY ? dstY1 : dstY0;
	IVec4	srcRect		= IVec4(srcOriginX, srcOriginY, srcW, srcH);
	IVec4	dstRect		= IVec4(dstOriginX, dstOriginY, dstW, dstH);

	RC_IF_ERROR(filter != GL_NEAREST && filter != GL_LINEAR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((mask & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0 && filter != GL_NEAREST, GL_INVALID_OPERATION, RC_RET_VOID);

	// Validate that both targets are complete.
	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE ||
				checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check samples count is valid
	RC_IF_ERROR(getDrawColorbuffer().getNumSamples() != 1, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check size restrictions of multisampled case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		// Src and Dst rect dimensions must be the same
		RC_IF_ERROR(srcW != dstW || srcH != dstH, GL_INVALID_OPERATION, RC_RET_VOID);

		// Framebuffer formats must match
		if (mask & GL_COLOR_BUFFER_BIT)		RC_IF_ERROR(getReadColorbuffer().raw().getFormat()   != getDrawColorbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_DEPTH_BUFFER_BIT)		RC_IF_ERROR(getReadDepthbuffer().raw().getFormat()   != getDrawDepthbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_STENCIL_BUFFER_BIT)	RC_IF_ERROR(getReadStencilbuffer().raw().getFormat() != getDrawStencilbuffer().raw().getFormat(), GL_INVALID_OPERATION, RC_RET_VOID);
	}

	// Compute actual source rect.
	srcRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadColorbuffer()))	: srcRect;
	srcRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadDepthbuffer()))	: srcRect;
	srcRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(srcRect, getBufferRect(getReadStencilbuffer()))	: srcRect;

	// Compute destination rect.
	dstRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawColorbuffer()))	: dstRect;
	dstRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawDepthbuffer()))	: dstRect;
	dstRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(dstRect, getBufferRect(getDrawStencilbuffer()))	: dstRect;
	dstRect = m_scissorEnabled					? intersect(dstRect, m_scissorBox)							: dstRect;

	if (isEmpty(srcRect) || isEmpty(dstRect))
		return; // Don't attempt copy.

	// Multisampled read buffer is a special case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		deUint32 error = blitResolveMultisampleFramebuffer(mask, srcRect, dstRect, swapSrcX ^ swapDstX, swapSrcY ^ swapDstY);

		if (error != GL_NO_ERROR)
			setError(error);

		return;
	}

	// \note Multisample pixel buffers can now be accessed like non-multisampled because multisample read buffer case is already handled. => sample count must be 1

	// Coordinate transformation:
	// Dst offset space -> dst rectangle space -> src rectangle space -> src offset space.
	tcu::Mat3 transform = tcu::translationMatrix(Vec2((float)(srcX0 - srcRect.x()), (float)(srcY0 - srcRect.y())))
						* tcu::Mat3(Vec3((float)(srcX1-srcX0) / (float)(dstX1-dstX0),
										 (float)(srcY1-srcY0) / (float)(dstY1-dstY0),
										 1.0f))
						* tcu::translationMatrix(Vec2((float)(dstRect.x() - dstX0), (float)(dstRect.y() - dstY0)));

	if (mask & GL_COLOR_BUFFER_BIT)
	{
		tcu::ConstPixelBufferAccess		src			= tcu::getSubregion(getReadColorbuffer().toSinglesampleAccess(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess			dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass		dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool							dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
													  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
													  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		tcu::Sampler::FilterMode		sFilter		= (scale && filter == GL_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;
		tcu::Sampler					sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
													 sFilter, sFilter, 0.0f /* lod threshold */, false /* non-normalized coords */);
		bool							srcIsSRGB	= tcu::isSRGB(src.getFormat());
		bool							dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool						convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			src	= tcu::ConstPixelBufferAccess	(toNonSRGBFormat(src.getFormat()), src.getWidth(), src.getHeight(), src.getDepth(), src.getRowPitch(), src.getSlicePitch(), src.getDataPtr());
			dst	= tcu::PixelBufferAccess		(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		// \note We don't check for unsupported conversions, unlike spec requires.

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;

				// \note Only affine part is used.
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				// do not copy pixels outside the modified source region (modified by buffer intersection)
				if (sX < 0.0f || sX >= (float)srcRect.z() ||
					sY < 0.0f || sY >= (float)srcRect.w())
					continue;

				if (dstIsFloat || srcIsSRGB || filter == tcu::Sampler::LINEAR)
				{
					Vec4 p = src.sample2D(sampler, sampler.minFilter, sX, sY, 0);
					dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, xo, yo);
				}
				else
					dst.setPixel(src.getPixelInt(deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)), xo, yo);
			}
		}
	}

	if ((mask & GL_DEPTH_BUFFER_BIT) && m_depthMask)
	{
		rr::MultisampleConstPixelBufferAccess	src		= getDepthMultisampleAccess(rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst		= getDepthMultisampleAccess(rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int sampleNdx = 0; // multisample read buffer case is already handled

				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				writeDepthOnly(dst, sampleNdx, xo, yo, src.raw().getPixDepth(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)));
			}
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int	sampleNdx = 0; // multisample read buffer case is already handled

				float		dX			= (float)xo + 0.5f;
				float		dY			= (float)yo + 0.5f;
				float		sX			= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float		sY			= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);
				deUint32	srcStencil	= src.raw().getPixelUint(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)).x();

				writeMaskedStencil(dst, sampleNdx, xo, yo, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
			}
		}
	}
}